

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_type_info.cpp
# Opt level: O2

string * __thiscall
duckdb::CreateTypeInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateTypeInfo *this)

{
  string *__return_storage_ptr___00;
  LogicalTypeId LVar1;
  idx_t iVar2;
  ExtraTypeInfo *pEVar3;
  pointer pSVar4;
  NotImplementedException *this_00;
  Value *this_01;
  idx_t index;
  LogicalType *this_02;
  allocator local_e9;
  optional_ptr<duckdb::ExtraTypeInfo,_true> extra_info;
  Value local_c0;
  idx_t local_80;
  Vector *local_78;
  undefined1 local_70 [64];
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_c0);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_CreateInfo).temporary == true) {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_c0,"CREATE TEMPORARY TYPE can\'t be parsed currently",
               (allocator *)&extra_info);
    NotImplementedException::NotImplementedException(this_00,(string *)&local_c0);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_CreateInfo).temporary == true) {
    ::std::__cxx11::string::string((string *)&extra_info,anon_var_dwarf_4b0ffdd + 9,&local_e9);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&extra_info,(string *)&(this->super_CreateInfo).catalog);
  }
  ParseInfo::QualifierToString
            ((string *)&local_c0,(string *)&extra_info,&(this->super_CreateInfo).schema,&this->name)
  ;
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&extra_info);
  LVar1 = (this->type).id_;
  if (LVar1 == INVALID) {
    pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(&this->query);
    (*pSVar4->_vptr_SQLStatement[2])(local_70,pSVar4);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &extra_info," AS ENUM (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &extra_info,")");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&extra_info);
    this_01 = (Value *)local_70;
  }
  else {
    if (LVar1 == USER) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      extra_info.ptr =
           (this->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pEVar3 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&extra_info);
      ParseInfo::QualifierToString
                ((string *)&local_c0,(string *)(pEVar3 + 1),(string *)&pEVar3[1].alias.field_2,
                 (string *)&pEVar3[2].type);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      this_02 = &this->type;
      if (LVar1 == ENUM) {
        local_78 = EnumType::GetValuesInsertOrder(this_02);
        iVar2 = EnumType::GetSize(this_02);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_80 = iVar2 - 1;
        __return_storage_ptr___00 = (string *)(local_70 + 0x20);
        for (index = 0; iVar2 != index; index = index + 1) {
          Vector::GetValue(&local_c0,local_78,index);
          Value::ToString_abi_cxx11_(__return_storage_ptr___00,&local_c0);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,"\'",__return_storage_ptr___00);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &extra_info,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,"\'");
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&extra_info);
          ::std::__cxx11::string::~string((string *)local_70);
          ::std::__cxx11::string::~string((string *)__return_storage_ptr___00);
          Value::~Value(&local_c0);
          if (local_80 != index) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        goto LAB_0166f9b2;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      LogicalType::ToString_abi_cxx11_((string *)&local_c0,this_02);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    this_01 = &local_c0;
  }
  ::std::__cxx11::string::~string((string *)this_01);
LAB_0166f9b2:
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CreateTypeInfo::ToString() const {
	string result = "";
	result += "CREATE";
	if (temporary) {
		// These are created by PIVOT
		throw NotImplementedException("CREATE TEMPORARY TYPE can't be parsed currently");
	}
	result += " TYPE ";
	result += QualifierToString(temporary ? "" : catalog, schema, name);
	if (type.id() == LogicalTypeId::ENUM) {
		auto &values_insert_order = EnumType::GetValuesInsertOrder(type);
		idx_t size = EnumType::GetSize(type);

		result += " AS ENUM ( ";
		for (idx_t i = 0; i < size; i++) {
			result += "'" + values_insert_order.GetValue(i).ToString() + "'";
			if (i != size - 1) {
				result += ", ";
			}
		}
		result += " );";
	} else if (type.id() == LogicalTypeId::INVALID) {
		// CREATE TYPE mood AS ENUM (SELECT 'happy')
		D_ASSERT(query);
		result += " AS ENUM (" + query->ToString() + ")";
	} else if (type.id() == LogicalTypeId::USER) {
		result += " AS ";
		auto extra_info = type.AuxInfo();
		D_ASSERT(extra_info);
		D_ASSERT(extra_info->type == ExtraTypeInfoType::USER_TYPE_INFO);
		auto &user_info = extra_info->Cast<UserTypeInfo>();
		result += QualifierToString(user_info.catalog, user_info.schema, user_info.user_type_name);
	} else {
		result += " AS ";
		result += type.ToString();
	}
	result += ";";
	return result;
}